

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O0

ssize_t __thiscall xmrig::CudaConfig::read(CudaConfig *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  undefined1 uVar2;
  Value *this_00;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t extraout_RAX_01;
  ssize_t sVar3;
  undefined7 uVar4;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf_00;
  undefined4 in_register_00000034;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_01;
  Value *nvml;
  CudaConfig *in_stack_00000020;
  char *in_stack_00000058;
  CudaConfig *in_stack_00000060;
  char *in_stack_ffffffffffffffd8;
  Value *in_stack_ffffffffffffffe8;
  int __fd_00;
  CudaConfig *obj;
  
  this_01 = (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)CONCAT44(in_register_00000034,__fd);
  uVar4 = (undefined7)(__nbytes >> 8);
  obj = this;
  bVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::IsObject(this_01);
  if (bVar1) {
    uVar2 = Json::getBool((Value *)obj,(char *)this_01,
                          SUB81((ulong)in_stack_ffffffffffffffe8 >> 0x38,0));
    this->m_enabled = (bool)uVar2;
    Json::getString((Value *)obj,(char *)this_01,(char *)in_stack_ffffffffffffffe8);
    String::operator=((String *)this,in_stack_ffffffffffffffd8);
    Json::getString((Value *)obj,(char *)this_01,(char *)in_stack_ffffffffffffffe8);
    __fd_00 = (int)this_01;
    setDevicesHint(in_stack_00000060,in_stack_00000058);
    this_00 = Json::getValue(in_stack_ffffffffffffffe8,&this->m_enabled);
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsString(this_00);
    if (bVar1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GetString(this_00);
      String::operator=((String *)this,in_stack_ffffffffffffffd8);
      __buf_00 = extraout_RDX;
    }
    else {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::IsBool(this_00);
      __buf_00 = extraout_RDX_00;
      if (bVar1) {
        uVar2 = rapidjson::
                GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                ::GetBool(this_00);
        this->m_nvml = (bool)uVar2;
        __buf_00 = extraout_RDX_01;
      }
    }
    Threads<xmrig::CudaThreads>::read(&this->m_threads,__fd_00,__buf_00,CONCAT71(uVar4,uVar2));
    generate(in_stack_00000020);
    sVar3 = extraout_RAX;
  }
  else {
    bVar1 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::IsBool(this_01);
    if (bVar1) {
      bVar1 = rapidjson::
              GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              ::GetBool(this_01);
      this->m_enabled = bVar1;
      generate(in_stack_00000020);
      sVar3 = extraout_RAX_00;
    }
    else {
      this->m_shouldSave = true;
      generate(in_stack_00000020);
      sVar3 = extraout_RAX_01;
    }
  }
  return sVar3;
}

Assistant:

void xmrig::CudaConfig::read(const rapidjson::Value &value)
{
    if (value.IsObject()) {
        m_enabled   = Json::getBool(value, kEnabled, m_enabled);
        m_loader    = Json::getString(value, kLoader);

        setDevicesHint(Json::getString(value, kDevicesHint));

#       ifdef XMRIG_FEATURE_NVML
        auto &nvml = Json::getValue(value, kNvml);
        if (nvml.IsString()) {
            m_nvmlLoader = nvml.GetString();
        }
        else if (nvml.IsBool()) {
            m_nvml = nvml.GetBool();
        }
#       endif

        m_threads.read(value);

        generate();
    }
    else if (value.IsBool()) {
        m_enabled = value.GetBool();

        generate();
    }
    else {
        m_shouldSave = true;

        generate();
    }
}